

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

int lo0bits(ULong *y)

{
  uint local_20;
  int local_1c;
  ULong x;
  int k;
  ULong *y_local;
  
  local_20 = *y;
  if ((local_20 & 7) == 0) {
    local_1c = 0;
    if ((local_20 & 0xffff) == 0) {
      local_1c = 0x10;
      local_20 = local_20 >> 0x10;
    }
    if ((local_20 & 0xff) == 0) {
      local_1c = local_1c + 8;
      local_20 = local_20 >> 8;
    }
    if ((local_20 & 0xf) == 0) {
      local_1c = local_1c + 4;
      local_20 = local_20 >> 4;
    }
    if ((local_20 & 3) == 0) {
      local_1c = local_1c + 2;
      local_20 = local_20 >> 2;
    }
    if ((local_20 & 1) == 0) {
      local_1c = local_1c + 1;
      local_20 = local_20 >> 1;
      if (local_20 == 0) {
        return 0x20;
      }
    }
    *y = local_20;
    y_local._4_4_ = local_1c;
  }
  else if ((local_20 & 1) == 0) {
    if ((local_20 & 2) == 0) {
      *y = local_20 >> 2;
      y_local._4_4_ = 2;
    }
    else {
      *y = local_20 >> 1;
      y_local._4_4_ = 1;
    }
  }
  else {
    y_local._4_4_ = 0;
  }
  return y_local._4_4_;
}

Assistant:

static int
lo0bits(ULong *y)
{
	int k;
	ULong x = *y;

	if (x & 7) {
		if (x & 1)
			return 0;
		if (x & 2) {
			*y = x >> 1;
			return 1;
			}
		*y = x >> 2;
		return 2;
		}
	k = 0;
	if (!(x & 0xffff)) {
		k = 16;
		x >>= 16;
		}
	if (!(x & 0xff)) {
		k += 8;
		x >>= 8;
		}
	if (!(x & 0xf)) {
		k += 4;
		x >>= 4;
		}
	if (!(x & 0x3)) {
		k += 2;
		x >>= 2;
		}
	if (!(x & 1)) {
		k++;
		x >>= 1;
		if (!x)
			return 32;
		}
	*y = x;
	return k;
	}